

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O2

void __thiscall
TasGrid::DynamicConstructorDataGlobal::restrictData
          (DynamicConstructorDataGlobal *this,int ibegin,int iend)

{
  _Fwd_list_impl _Var1;
  allocator_type local_49;
  vector<double,std::allocator<double>> local_48 [24];
  
  _Var1._M_head._M_next = (_Fwd_list_node_base)&this->data;
  while (_Var1._M_head._M_next = *(_Fwd_list_node_base *)_Var1._M_head._M_next,
        (_Fwd_list_impl)_Var1._M_head._M_next != (_Fwd_list_impl)0x0) {
    ::std::vector<double,std::allocator<double>>::
    vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
              (local_48,(double *)(*(long *)((long)_Var1._M_head._M_next + 0x20) + (long)ibegin * 8)
               ,(double *)(*(long *)((long)_Var1._M_head._M_next + 0x20) + (long)iend * 8),&local_49
              );
    ::std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)((long)_Var1._M_head._M_next + 0x20),
               local_48);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_48);
  }
  return;
}

Assistant:

void restrictData(int ibegin, int iend){ for(auto &d : data) d.value = std::vector<double>(d.value.begin() + ibegin, d.value.begin() + iend); }